

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pointer_based_iterator.cpp
# Opt level: O3

void __thiscall
PointerBasedIterator_IPlusEqualN_Test::TestBody(PointerBasedIterator_IPlusEqualN_Test *this)

{
  char *pcVar1;
  array<int,_2UL> arr;
  AssertHelper local_40;
  pointer_based_iterator<int> local_38;
  internal local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  AssertHelper local_20;
  Type local_18;
  undefined4 uStack_14;
  pointer_based_iterator<int> local_10;
  
  local_38.pos_ = (pointer)&stack0xfffffffffffffff0;
  local_18 = kNonFatalFailure;
  uStack_14 = 3;
  local_10.pos_ = local_38.pos_;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_30,"i1 += 2","iterator{&arr[0] + 2}",&stack0xfffffffffffffff0,&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38.pos_ != (long *)0x0) {
      (**(code **)(*(long *)local_38.pos_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  local_40.data_ = (AssertHelperData *)&stack0xffffffffffffffe8;
  local_38.pos_ = (pointer)local_40.data_;
  testing::internal::
  CmpHelperEQ<pstore::pointer_based_iterator<int>,pstore::pointer_based_iterator<int>>
            (local_30,"i2 += -2","iterator{&arr[0]}",&local_38,
             (pointer_based_iterator<int> *)&local_40);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_28->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_pointer_based_iterator.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (local_40.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_40.data_ + 8))();
    }
  }
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_28,local_28);
  }
  return;
}

Assistant:

TEST_F (PointerBasedIterator, IPlusEqualN) {
    std::array<int, 2> arr{{1, 3}};

    iterator i1{&arr[0]};
    EXPECT_EQ (i1 += 2, iterator{&arr[0] + 2});

    iterator i2{&arr[0] + 2};
    EXPECT_EQ (i2 += -2, iterator{&arr[0]});
}